

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConn.cpp
# Opt level: O1

ssize_t __thiscall HttpConn::read(HttpConn *this,int __fd,void *__buf,size_t __nbytes)

{
  EventLoop *pEVar1;
  bool bVar2;
  int iVar3;
  StatusCode code;
  ssize_t sVar4;
  code *extraout_RAX;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  code *extraout_RAX_00;
  undefined7 extraout_var_01;
  char *__n;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf_00;
  int __fd_00;
  long lVar5;
  pointer buff;
  _Any_data local_88;
  code *local_78;
  code *pcStack_70;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  
  lVar5 = (long)(this->readBuff_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->readBuff_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
  __n = (char *)__nbytes;
  if (lVar5 == this->read_idx_) {
    std::vector<char,_std::allocator<char>_>::resize(&this->readBuff_,lVar5 * 2);
    __n = (char *)__nbytes;
  }
  buff = (this->readBuff_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_start + this->read_idx_;
  sVar4 = readn(this->fd_,buff,
                (long)(this->readBuff_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)buff);
  __fd_00 = (int)buff;
  iVar3 = (int)sVar4;
  if (iVar3 < 0) {
    std::__cxx11::string::_M_replace
              ((ulong)&this->body_,0,(char *)(this->body_)._M_string_length,0x121a77);
    code = BadRequest;
  }
  else {
    if (iVar3 == 0) {
      this->connStatus_ = Disconnecting;
      __buf_00 = extraout_RDX;
      if (this->parseState_ != Finished) {
        __n = "Request is not complete!";
        std::__cxx11::string::_M_replace
                  ((ulong)&this->body_,0,(char *)(this->body_)._M_string_length,0x121a8a);
        __fd_00 = 400;
        handleResponse(this,BadRequest);
        __buf_00 = extraout_RDX_00;
      }
      if (this->writeable_ != true) {
        pEVar1 = this->loop_;
        local_78 = (code *)0x0;
        pcStack_70 = (code *)0x0;
        local_88._M_unused._M_object = (void *)0x0;
        local_88._8_8_ = 0;
        local_88._M_unused._M_object = operator_new(0x18);
        *(code **)local_88._M_unused._0_8_ = close;
        *(undefined8 *)((long)local_88._M_unused._0_8_ + 8) = 0;
        *(HttpConn **)((long)local_88._M_unused._0_8_ + 0x10) = this;
        pcStack_70 = std::_Function_handler<void_(),_std::_Bind<void_(HttpConn::*(HttpConn_*))()>_>
                     ::_M_invoke;
        local_78 = std::_Function_handler<void_(),_std::_Bind<void_(HttpConn::*(HttpConn_*))()>_>::
                   _M_manager;
        EventLoop::runInLoop(pEVar1,(Functor *)&local_88);
        if (local_78 == (code *)0x0) {
          return (ssize_t)(code *)0x0;
        }
        bVar2 = (*local_78)(&local_88,&local_88,__destroy_functor);
        return CONCAT71(extraout_var_01,bVar2);
      }
      local_58 = (code *)write(this,__fd_00,__buf_00,(size_t)__n);
      goto LAB_00117024;
    }
    this->read_idx_ = this->read_idx_ + iVar3;
    code = parseRequest(this);
    if (code == Wait) {
      Channel::update((this->channel_).super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
      local_58 = extraout_RAX_00;
      goto LAB_00117024;
    }
  }
  handleResponse(this,code);
  local_58 = extraout_RAX;
LAB_00117024:
  if (this->connStatus_ == Connected) {
    pEVar1 = this->loop_;
    iVar3 = this->id_;
    if (this->linger_ == true) {
      local_58 = (code *)0x0;
      pcStack_50 = (code *)0x0;
      local_68._M_unused._M_object = (void *)0x0;
      local_68._8_8_ = 0;
      local_68._M_unused._M_object = operator_new(0x18);
      *(code **)local_68._M_unused._0_8_ = close;
      *(undefined8 *)((long)local_68._M_unused._0_8_ + 8) = 0;
      *(HttpConn **)((long)local_68._M_unused._0_8_ + 0x10) = this;
      pcStack_50 = std::_Function_handler<void_(),_std::_Bind<void_(HttpConn::*(HttpConn_*))()>_>::
                   _M_invoke;
      local_58 = std::_Function_handler<void_(),_std::_Bind<void_(HttpConn::*(HttpConn_*))()>_>::
                 _M_manager;
      EventLoop::addTimer(pEVar1,iVar3,90000,(Functor *)&local_68);
      if (local_58 != (code *)0x0) {
        bVar2 = (*local_58)(&local_68,&local_68,__destroy_functor);
        local_58 = (code *)CONCAT71(extraout_var,bVar2);
      }
    }
    else {
      local_38 = (code *)0x0;
      pcStack_30 = (code *)0x0;
      local_48._M_unused._M_object = (void *)0x0;
      local_48._8_8_ = 0;
      local_48._M_unused._M_object = operator_new(0x18);
      *(code **)local_48._M_unused._0_8_ = close;
      *(undefined8 *)((long)local_48._M_unused._0_8_ + 8) = 0;
      *(HttpConn **)((long)local_48._M_unused._0_8_ + 0x10) = this;
      pcStack_30 = std::_Function_handler<void_(),_std::_Bind<void_(HttpConn::*(HttpConn_*))()>_>::
                   _M_invoke;
      local_38 = std::_Function_handler<void_(),_std::_Bind<void_(HttpConn::*(HttpConn_*))()>_>::
                 _M_manager;
      EventLoop::addTimer(pEVar1,iVar3,8000,(Functor *)&local_48);
      local_58 = local_38;
      if (local_38 != (code *)0x0) {
        bVar2 = (*local_38)(&local_48,&local_48,__destroy_functor);
        local_58 = (code *)CONCAT71(extraout_var_00,bVar2);
      }
    }
  }
  return (ssize_t)local_58;
}

Assistant:

void HttpConn::read() {
    if (readBuff_.size() - read_idx_ == 0) readBuff_.resize(readBuff_.size() * 2);
    int readBytes = readn(fd_, readBuff_.data() + read_idx_, readBuff_.size() - read_idx_);
    if (readBytes < 0) {
        body_ = "Read Socket Error!";
        handleResponse(BadRequest);
    } else if (readBytes == 0) {
        connStatus_ = Disconnecting;
        if (parseState_ != Finished) {
            body_ = "Request is not complete!";
            handleResponse(BadRequest);
        }
        if (writeable_) 
            write();
        else {
            loop_->runInLoop(std::bind(&HttpConn::close, this));
            return;
        }
        
    }
    else {
        read_idx_ += readBytes;
        StatusCode c = parseRequest();
        if (c != Wait) {
            handleResponse(c);
        } else {
            channel_->update();
        }
    }
    
    if (connStatus_ == Connected) {
        if (linger_) 
            loop_->addTimer(id_, keepAliveTimeout, std::bind(&HttpConn::close, this)); 
        else 
            loop_->addTimer(id_, defaultTimeout, std::bind(&HttpConn::close, this));   
    }
    // handleConn();
}